

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void lj_mcode_limiterr(jit_State *J,size_t need)

{
  ulong uVar1;
  jit_State *J_00;
  ulong in_RSI;
  long in_RDI;
  size_t maxmcode;
  size_t sizemcode;
  TraceError in_stack_ffffffffffffffdc;
  
  lj_mcode_abort((jit_State *)0x199ac8);
  uVar1 = (long)*(int *)(in_RDI + 0x678) * 0x400 + 0xfffU & 0xfffffffffffff000;
  J_00 = (jit_State *)((long)*(int *)(in_RDI + 0x67c) << 10);
  if (uVar1 < in_RSI) {
    lj_trace_err(J_00,in_stack_ffffffffffffffdc);
  }
  if (J_00 < (jit_State *)(*(long *)(in_RDI + 0x9e8) + uVar1)) {
    lj_trace_err(J_00,in_stack_ffffffffffffffdc);
  }
  mcode_allocarea(J_00);
  lj_trace_err(J_00,in_stack_ffffffffffffffdc);
}

Assistant:

void lj_mcode_limiterr(jit_State *J, size_t need)
{
  size_t sizemcode, maxmcode;
  lj_mcode_abort(J);
  sizemcode = (size_t)J->param[JIT_P_sizemcode] << 10;
  sizemcode = (sizemcode + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  maxmcode = (size_t)J->param[JIT_P_maxmcode] << 10;
  if ((size_t)need > sizemcode)
    lj_trace_err(J, LJ_TRERR_MCODEOV);  /* Too long for any area. */
  if (J->szallmcarea + sizemcode > maxmcode)
    lj_trace_err(J, LJ_TRERR_MCODEAL);
  mcode_allocarea(J);
  lj_trace_err(J, LJ_TRERR_MCODELM);  /* Retry with new area. */
}